

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::MergeReturnPass::InsertAfterElement
          (MergeReturnPass *this,BasicBlock *element,BasicBlock *new_element,
          list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *list)

{
  _List_iterator<spvtools::opt::BasicBlock_*> _Var1;
  BasicBlock *local_18;
  BasicBlock *local_10;
  
  local_18 = new_element;
  local_10 = element;
  _Var1 = std::
          __find_if<std::_List_iterator<spvtools::opt::BasicBlock*>,__gnu_cxx::__ops::_Iter_equals_val<spvtools::opt::BasicBlock*const>>
                    ((list->
                     super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                     )._M_impl._M_node.super__List_node_base._M_next,list,&local_10);
  if (_Var1._M_node != (_List_node_base *)list) {
    std::__cxx11::list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
    insert(list,(_Var1._M_node)->_M_next,&local_18);
    return;
  }
  __assert_fail("pos != list->end()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                ,0x30a,
                "void spvtools::opt::MergeReturnPass::InsertAfterElement(BasicBlock *, BasicBlock *, std::list<BasicBlock *> *)"
               );
}

Assistant:

void MergeReturnPass::InsertAfterElement(BasicBlock* element,
                                         BasicBlock* new_element,
                                         std::list<BasicBlock*>* list) {
  auto pos = std::find(list->begin(), list->end(), element);
  assert(pos != list->end());
  ++pos;
  list->insert(pos, new_element);
}